

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement(IfcRelFillsElement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x81b0f0;
  *(undefined8 *)&this->field_0xc8 = 0x81b118;
  pcVar3 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.
           _M_dataplus._M_p;
  paVar1 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.field_2
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr._M_dataplus.
           _M_p;
  paVar1 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  puVar2 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20;
  if (puVar4 != puVar2) {
    operator_delete(puVar4,*(long *)puVar2 + 1);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}